

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miditime.cpp
# Opt level: O0

void processMidiFile(MidiFile *midifile)

{
  int iVar1;
  int iVar2;
  int iVar3;
  MidiEventList *this;
  MidiEvent *this_00;
  byte *pbVar4;
  reference pvVar5;
  ostream *poVar6;
  size_type sVar7;
  void *pvVar8;
  bool bVar9;
  double dVar10;
  int local_40;
  int j;
  int attack;
  double timeinsecs;
  int timeinticks;
  int track;
  int i;
  MidiEvent *ptr;
  int eventcount;
  MidiFile *midifile_local;
  
  smf::MidiFile::absoluteTicks(midifile);
  smf::MidiFile::joinTracks(midifile);
  iVar3 = smf::MidiFile::getEventCount(midifile,0);
  for (timeinticks = 0; timeinticks < iVar3; timeinticks = timeinticks + 1) {
    this = smf::MidiFile::operator[](midifile,0);
    this_00 = smf::MidiEventList::operator[](this,timeinticks);
    iVar1 = this_00->track;
    iVar2 = this_00->tick;
    dVar10 = smf::MidiFile::getTimeInSeconds(midifile,0,timeinticks);
    pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,0);
    bVar9 = (*pbVar4 & 0xf0) == 0x90;
    if (((onsetQ == 0) || (bVar9)) &&
       ((onsetQ == 0 ||
        ((!bVar9 ||
         (pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,2),
         *pvVar5 != '\0')))))) {
      poVar6 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
      std::operator<<(poVar6,"\t");
      poVar6 = (ostream *)std::ostream::operator<<(&std::cout,dVar10);
      std::operator<<(poVar6,"\t");
      poVar6 = (ostream *)std::ostream::operator<<(&std::cout,iVar1);
      std::operator<<(poVar6,"\t");
      poVar6 = (ostream *)std::ostream::operator<<(&std::cout,timeinticks);
      std::operator<<(poVar6,"\t");
      for (local_40 = 0;
          sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00),
          local_40 < (int)sVar7; local_40 = local_40 + 1) {
        if (local_40 == 0) {
          poVar6 = std::operator<<((ostream *)&std::cout,"0x");
          pvVar8 = (void *)std::ostream::operator<<(poVar6,std::hex);
          pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,0);
          pvVar8 = (void *)std::ostream::operator<<(pvVar8,(uint)*pbVar4);
          poVar6 = (ostream *)std::ostream::operator<<(pvVar8,std::dec);
          std::operator<<(poVar6," ");
        }
        else {
          pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
                              (long)local_40);
          poVar6 = (ostream *)std::ostream::operator<<(&std::cout,(uint)*pbVar4);
          std::operator<<(poVar6," ");
        }
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void processMidiFile(MidiFile& midifile) {
   midifile.absoluteTicks();
   midifile.joinTracks();
   int eventcount = midifile.getEventCount(0);
   MidiEvent *ptr;
   for (int i=0; i<eventcount; i++) {
      ptr = &(midifile[0][i]);
      int track       = ptr->track;
      int timeinticks = ptr->tick;
      double timeinsecs  = midifile.getTimeInSeconds(0, i);
      int attack = ((*ptr)[0] & 0xf0) == 0x90;
      if (onsetQ && !attack) {
         continue;
      }
      if (onsetQ && attack) {
         if ((*ptr)[2] == 0) {
            continue;
         }
      }
      
      cout << timeinticks << "\t";
      cout << timeinsecs << "\t";
      cout << track << "\t";
      cout << i << "\t";
      for (int j=0; j<(int)ptr->size(); j++) {
         if (j == 0) {
            cout << "0x" << hex << (int)(*ptr)[j] << dec << " ";
         } else {
            cout << (int)(*ptr)[j] << " ";
         }
      }
      cout << endl;
   }
}